

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::Newline,char_const(&)[33],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
          (CWriter *this,Newline *t,char (*u) [33],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [13],OpenBrace *args_2)

{
  string_view local_50;
  OpenBrace *local_38;
  OpenBrace *args_local_2;
  char (*args_local_1) [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char (*u_local) [33];
  Newline *t_local;
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (OpenBrace *)args_1;
  args_local_1 = (char (*) [13])args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)u;
  u_local = (char (*) [33])t;
  t_local = (Newline *)this;
  anon_unknown_0::CWriter::Write();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,(char *)args_local);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_50);
  Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local_1,
             (char (*) [13])args_local_2,local_38);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }